

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O0

int Gia_ManFindDivGateInt
              (word *pOff,word *pOn,Vec_Ptr_t *vDivs,int nWords,Vec_Int_t *vUnateLits,
              Vec_Int_t *vUnatePairs,Vec_Int_t *vUnateLitsW,Vec_Int_t *vUnatePairsW,word *pDivTemp)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int ComplB;
  uint uVar6;
  word *pDivA;
  int fComp1;
  word *pDiv0;
  int nTotal;
  int Cover1;
  int Cover0;
  int iDiv1;
  int iDiv0;
  int k;
  int i;
  Vec_Int_t *vUnatePairs_local;
  Vec_Int_t *vUnateLits_local;
  int nWords_local;
  Vec_Ptr_t *vDivs_local;
  word *pOn_local;
  word *pOff_local;
  
  iVar1 = Abc_TtCountOnesVec(pOn,nWords);
  iDiv0 = 0;
  do {
    iVar2 = Vec_IntSize(vUnateLits);
    if (iVar2 <= iDiv0) {
      return -1;
    }
    iVar2 = Vec_IntEntry(vUnateLits,iDiv0);
    iVar3 = Vec_IntEntry(vUnateLitsW,iDiv0);
    iVar4 = Abc_Lit2Var(iVar2);
    pDivA = (word *)Vec_PtrEntry(vDivs,iVar4);
    if (iVar3 * 2 < iVar1) {
      return -1;
    }
    for (iDiv1 = 0; iVar4 = Vec_IntSize(vUnatePairs), iDiv1 < iVar4; iDiv1 = iDiv1 + 1) {
      iVar4 = Vec_IntEntry(vUnatePairs,iDiv1);
      iVar5 = Vec_IntEntry(vUnatePairsW,iDiv1);
      ComplB = Abc_LitIsCompl(iVar4);
      if (iVar3 + iVar5 < iVar1) break;
      Gia_ManDeriveDivPair(iVar4,vDivs,nWords,pDivTemp);
      iVar4 = Abc_LitIsCompl(iVar2);
      iVar4 = Gia_ManDivCover(pOff,pOn,pDivA,iVar4,pDivTemp,ComplB,nWords);
      if (iVar4 != 0) {
        iVar1 = Abc_Var2Lit(iDiv1,1);
        uVar6 = Abc_LitNot(iVar2);
        iVar1 = Abc_Var2Lit(iVar1 << 0xf | uVar6,1);
        return iVar1;
      }
    }
    iDiv0 = iDiv0 + 1;
  } while( true );
}

Assistant:

int Gia_ManFindDivGateInt( word * pOff, word * pOn, Vec_Ptr_t * vDivs, int nWords, Vec_Int_t * vUnateLits, Vec_Int_t * vUnatePairs, Vec_Int_t * vUnateLitsW, Vec_Int_t * vUnatePairsW, word * pDivTemp )
{
    int i, k, iDiv0, iDiv1, Cover0, Cover1;
    int nTotal = Abc_TtCountOnesVec( pOn, nWords );
    Vec_IntForEachEntryTwo( vUnateLits, vUnateLitsW, iDiv0, Cover0, i )
    {
        word * pDiv0 = (word *)Vec_PtrEntry(vDivs, Abc_Lit2Var(iDiv0));
        if ( 2*Cover0 < nTotal )
            break;
        Vec_IntForEachEntryTwo( vUnatePairs, vUnatePairsW, iDiv1, Cover1, k )
        {
            int fComp1 = Abc_LitIsCompl(iDiv1);
            if ( Cover0 + Cover1 < nTotal )
                break;
            Gia_ManDeriveDivPair( iDiv1, vDivs, nWords, pDivTemp );
            if ( Gia_ManDivCover(pOff, pOn, pDiv0, Abc_LitIsCompl(iDiv0), pDivTemp, fComp1, nWords) )
                return Abc_Var2Lit((Abc_Var2Lit(k, 1) << 15) | Abc_LitNot(iDiv0), 1);
        }
    }
    return -1;
}